

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O1

double libcalc::eval(string *expr)

{
  pointer pcVar1;
  Tokenizer *this;
  string local_48;
  double local_28;
  
  this = (Tokenizer *)operator_new(0x18);
  pcVar1 = (expr->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + expr->_M_string_length);
  Tokenizer::Tokenizer(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_28 = Tokenizer::evaluate(this);
  Tokenizer::~Tokenizer(this);
  operator_delete(this);
  return local_28;
}

Assistant:

double eval(std::string expr) {
  double result = 0;

  Tokenizer *t = new Tokenizer(expr);
  result = t->evaluate();
  delete t;

  return result;
}